

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cachedarena.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  MemSegment *pMVar1;
  long *plVar2;
  MemSegment *pMVar3;
  long lVar4;
  int i;
  size_type sVar5;
  NoActionMemLogger logger;
  MallocArena arena;
  CachedArena<cookmem::MallocArena> cachedArena;
  void *ptrs [9];
  NoActionMemLogger local_2f1;
  MallocArena local_2f0;
  CachedArena<cookmem::MallocArena> local_2e8;
  undefined8 auStack_2d8 [9];
  undefined **local_290;
  CachedArena<cookmem::MallocArena> *local_288;
  NoActionMemLogger *local_280;
  MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void> local_278;
  
  local_2e8.m_arena = &local_2f0;
  local_2f0.m_minSize = 0x10000;
  local_2e8.m_tree.m_root = (Node *)0x0;
  local_290 = &PTR__MemContext_00105d88;
  lVar4 = 0;
  local_288 = &local_2e8;
  local_280 = &local_2f1;
  local_278.m_arena = &local_2e8;
  local_278.m_logger = &local_2f1;
  memset(&local_278.m_footprintLimit,0,0x232);
  local_278.m_paddingByte = -0x33;
  sVar5 = 3;
  while( true ) {
    sVar5 = sVar5 * 10;
    pMVar1 = (MemSegment *)
             cookmem::
             MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
             allocate(&local_278,sVar5);
    auStack_2d8[lVar4] = pMVar1;
    pMVar3 = local_278.m_segList;
    while( true ) {
      if (pMVar3 == (MemSegment *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Mismatch at line ",0x11);
        plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x2a);
        std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
        goto LAB_0010239e;
      }
      if ((pMVar3 <= pMVar1) && (pMVar1 <= (MemSegment *)((long)&pMVar3->m_size + pMVar3->m_size)))
      break;
      pMVar3 = pMVar3->m_next;
    }
    if (pMVar1 == (MemSegment *)0x0) break;
    lVar4 = lVar4 + 1;
    if (lVar4 == 9) {
      lVar4 = 0;
      do {
        cookmem::
        MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
        deallocate(&local_278,(void *)auStack_2d8[lVar4],0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 9);
      while (local_278.m_segList != (MemSegment *)0x0) {
        pMVar3 = (local_278.m_segList)->m_next;
        cookmem::PtrAVLTree::add
                  (&(local_278.m_arena)->m_tree,local_278.m_segList,(local_278.m_segList)->m_size);
        local_278.m_segList = pMVar3;
      }
      local_278.m_segList = (MemSegment *)0x0;
      lVar4 = 0;
      memset(&local_278.m_smallMap,0,0x210);
      local_290 = &PTR__MemContext_00105d88;
      cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>
      ::~MemPool(&local_278);
      local_290 = &PTR__MemContext_00105d88;
      local_288 = &local_2e8;
      local_280 = &local_2f1;
      local_278.m_arena = &local_2e8;
      local_278.m_logger = &local_2f1;
      memset(&local_278.m_footprintLimit,0,0x232);
      local_278.m_paddingByte = -0x33;
      sVar5 = 3;
      while( true ) {
        sVar5 = sVar5 * 10;
        pMVar1 = (MemSegment *)
                 cookmem::
                 MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>
                 ::allocate(&local_278,sVar5);
        auStack_2d8[lVar4] = pMVar1;
        pMVar3 = local_278.m_segList;
        while( true ) {
          if (pMVar3 == (MemSegment *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Mismatch at line ",0x11);
            plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x44);
            std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
            goto LAB_001025b0;
          }
          if ((pMVar3 <= pMVar1) &&
             (pMVar1 <= (MemSegment *)((long)&pMVar3->m_size + pMVar3->m_size))) break;
          pMVar3 = pMVar3->m_next;
        }
        if (pMVar1 == (MemSegment *)0x0) break;
        lVar4 = lVar4 + 1;
        if (lVar4 == 9) {
          lVar4 = 0;
          do {
            cookmem::
            MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
            deallocate(&local_278,(void *)auStack_2d8[lVar4],0);
            lVar4 = lVar4 + 1;
            pMVar3 = local_278.m_segList;
          } while (lVar4 != 9);
          while (pMVar3 != (MemSegment *)0x0) {
            pMVar1 = pMVar3->m_next;
            cookmem::PtrAVLTree::add(&(local_278.m_arena)->m_tree,pMVar3,pMVar3->m_size);
            pMVar3 = pMVar1;
          }
          local_278.m_segList = (MemSegment *)0x0;
          memset(&local_278.m_smallMap,0,0x210);
          local_290 = &PTR__MemContext_00105d88;
          cookmem::
          MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
          ~MemPool(&local_278);
          return 0;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x45);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
LAB_001025b0:
      std::ostream::put((char)plVar2);
      std::ostream::flush();
LAB_001023b1:
      local_290 = &PTR__MemContext_00105d88;
      cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>
      ::~MemPool(&local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Mismatch at line ",0x11);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x5b);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      return 1;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mismatch at line ",0x11)
  ;
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x2b);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
LAB_0010239e:
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  goto LAB_001023b1;
}

Assistant:

int
main (int argc, const char* argv[])
{
    ASSERT_EQ (0, test1 ());

    return 0;
}